

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

size_t phosg::init_bmp_header
                 (WindowsBitmapHeader *header,ssize_t width,ssize_t height,bool has_alpha,
                 size_t pixel_bytes,size_t row_padding_bytes)

{
  uint uVar1;
  undefined3 in_register_00000009;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  iVar2 = CONCAT31(in_register_00000009,has_alpha);
  lVar6 = 0x28;
  if (iVar2 != 0) {
    lVar6 = 0x7c;
  }
  (header->info_header).reserved.super_same_endian<unsigned_int,_unsigned_int>.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
  .value = 0;
  iVar3 = (int)height;
  iVar4 = iVar3 * (int)width;
  uVar1 = (uint)(lVar6 + 0xeU);
  (header->file_header).reserved[0] = (same_endian<unsigned_short,_unsigned_short>)0x0;
  (header->file_header).reserved[1] = (same_endian<unsigned_short,_unsigned_short>)0x0;
  uVar5 = iVar4 * 4;
  (header->info_header).gamma_b = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).render_intent = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).color_profile_data = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).color_profile_size = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[7] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[8] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).gamma_r = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).gamma_g = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[3] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[4] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[5] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[6] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).color_space_type = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[0] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[1] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).chromacity_endpoints[2] = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).bitmask_r = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).bitmask_g = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).bitmask_b = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).bitmask_a = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->file_header).magic.super_same_endian<unsigned_short,_unsigned_short>.
  super_converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
  .value = 0x4d42;
  (header->file_header).file_size.super_same_endian<unsigned_int,_unsigned_int>.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
  .value = (int)row_padding_bytes * iVar3 + uVar1 + (int)pixel_bytes * iVar4;
  (header->file_header).data_offset.super_same_endian<unsigned_int,_unsigned_int>.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
  .value = uVar1;
  (header->info_header).header_size.super_same_endian<unsigned_int,_unsigned_int>.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
  .value = (uint)lVar6;
  (header->info_header).width.super_same_endian<int,_int>.
  super_converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_>.value =
       (int)width;
  (header->info_header).height.super_same_endian<int,_int>.
  super_converted_endian<int,_int,_phosg::ident_st<int,_int>,_phosg::ident_st<int,_int>_>.value =
       iVar3;
  (header->info_header).num_planes.super_same_endian<unsigned_short,_unsigned_short>.
  super_converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
  .value = 1;
  (header->info_header).bit_depth.super_same_endian<unsigned_short,_unsigned_short>.
  super_converted_endian<unsigned_short,_unsigned_short,_phosg::ident_st<unsigned_short,_unsigned_short>,_phosg::ident_st<unsigned_short,_unsigned_short>_>
  .value = (short)iVar2 * 8 + 0x18;
  if (iVar2 == 0) {
    uVar5 = 0;
  }
  (header->info_header).compression.super_same_endian<unsigned_int,_unsigned_int>.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
  .value = iVar2 * 3;
  (header->info_header).image_size.super_same_endian<unsigned_int,_unsigned_int>.
  super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
  .value = uVar5;
  (header->info_header).x_pixels_per_meter = (same_endian<int,_int>)0xb12;
  (header->info_header).y_pixels_per_meter = (same_endian<int,_int>)0xb12;
  (header->info_header).num_used_colors = (same_endian<unsigned_int,_unsigned_int>)0x0;
  (header->info_header).num_important_colors = (same_endian<unsigned_int,_unsigned_int>)0x0;
  if (iVar2 != 0) {
    (header->info_header).bitmask_r = (same_endian<unsigned_int,_unsigned_int>)0xff;
    (header->info_header).bitmask_g = (same_endian<unsigned_int,_unsigned_int>)0xff00;
    (header->info_header).bitmask_b = (same_endian<unsigned_int,_unsigned_int>)0xff0000;
    (header->info_header).bitmask_a = (same_endian<unsigned_int,_unsigned_int>)0xff000000;
    (header->info_header).color_space_type.super_same_endian<unsigned_int,_unsigned_int>.
    super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    .value = 0x73524742;
    (header->info_header).render_intent.super_same_endian<unsigned_int,_unsigned_int>.
    super_converted_endian<unsigned_int,_unsigned_int,_phosg::ident_st<unsigned_int,_unsigned_int>,_phosg::ident_st<unsigned_int,_unsigned_int>_>
    .value = 8;
  }
  return lVar6 + 0xeU;
}

Assistant:

static size_t init_bmp_header(WindowsBitmapHeader& header,
    ssize_t width, ssize_t height, bool has_alpha,
    size_t pixel_bytes, size_t row_padding_bytes) {
  size_t header_size = sizeof(WindowsBitmapFileHeader) + (has_alpha ? sizeof(WindowsBitmapInfoHeader) : WindowsBitmapInfoHeader::SIZE24);

  // Clear header so we don't have initialize fields that are 0
  header = {};
  header.file_header.magic = 0x4D42; // 'BM'
  header.file_header.file_size = header_size + (width * height * pixel_bytes) + (row_padding_bytes * height);
  header.file_header.reserved[0] = 0;
  header.file_header.reserved[1] = 0;
  header.file_header.data_offset = header_size;
  header.info_header.header_size = header_size - sizeof(WindowsBitmapFileHeader);
  header.info_header.width = width;
  header.info_header.height = height;
  header.info_header.num_planes = 1;
  header.info_header.bit_depth = has_alpha ? 32 : 24;
  header.info_header.compression = has_alpha ? 3 : 0; // BI_BITFIELDS or BI_RGB
  header.info_header.image_size = has_alpha ? (width * height * 4) : 0; // 0 acceptable for BI_RGB
  header.info_header.x_pixels_per_meter = 0x00000B12;
  header.info_header.y_pixels_per_meter = 0x00000B12;
  header.info_header.num_used_colors = 0;
  header.info_header.num_important_colors = 0;
  if (has_alpha) {
    // Write V5 header
    header.info_header.bitmask_r = 0x000000FF;
    header.info_header.bitmask_g = 0x0000FF00;
    header.info_header.bitmask_b = 0x00FF0000;
    header.info_header.bitmask_a = 0xFF000000;
    header.info_header.color_space_type = 0x73524742; // LCS_sRGB / 'sRGB'
    header.info_header.render_intent = 8; // LCS_GM_ABS_COLORIMETRIC
  }

  return header_size;
}